

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O1

bool S2LatLngRect::IntersectsLatEdge(S2Point *a,S2Point *b,double lat,S1Interval *lng)

{
  bool bVar1;
  double dVar2;
  undefined8 extraout_XMM0_Qb;
  Vector3_d x;
  S1Interval ab_theta;
  Vector3_d local_100;
  double local_e8;
  double local_e0;
  double local_d8;
  S2Point local_d0;
  double local_b8;
  double local_a8;
  double local_90;
  S2LogMessage local_88;
  double local_78;
  undefined8 uStack_70;
  S2Point local_68;
  S2LogMessage local_48;
  S2LogMessage local_38;
  
  local_88.stream_ = (ostream *)local_88._0_8_;
  local_b8 = lat;
  bVar1 = S2::IsUnitLength(a);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x186,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_38.stream_,"Check failed: S2::IsUnitLength(a) ",0x22);
    if (!bVar1) goto LAB_001f8411;
  }
  bVar1 = S2::IsUnitLength(b);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x187,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_48.stream_,"Check failed: S2::IsUnitLength(b) ",0x22);
    if (!bVar1) goto LAB_001f8411;
  }
  S2::RobustCrossProd(&local_100,a,b);
  dVar2 = local_100.c_[2] * local_100.c_[2] +
          local_100.c_[1] * local_100.c_[1] + local_100.c_[0] * local_100.c_[0];
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  local_d0.c_[2] =
       (VType)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
              (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
  local_d0.c_[0] = local_100.c_[0] * local_d0.c_[2];
  local_d0.c_[1] = local_100.c_[1] * local_d0.c_[2];
  local_d0.c_[2] = local_d0.c_[2] * local_100.c_[2];
  if (local_d0.c_[2] < 0.0) {
    local_d0.c_[2] = -local_d0.c_[2];
    local_d0.c_[0] = -local_d0.c_[0];
    local_d0.c_[1] = -local_d0.c_[1];
  }
  local_68.c_[0] = 0.0;
  local_68.c_[1] = 0.0;
  local_68.c_[2] = 1.0;
  S2::RobustCrossProd(&local_100,&local_d0,&local_68);
  uStack_70 = 0;
  dVar2 = local_100.c_[2] * local_100.c_[2] +
          local_100.c_[1] * local_100.c_[1] + local_100.c_[0] * local_100.c_[0];
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
    uStack_70 = extraout_XMM0_Qb;
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  local_78 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                     (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
  local_e8 = local_100.c_[0] * local_78;
  local_e0 = local_100.c_[1] * local_78;
  local_78 = local_78 * local_100.c_[2];
  local_100.c_[0] = local_e0 * local_d0.c_[2] - local_78 * local_d0.c_[1];
  local_100.c_[1] = local_78 * local_d0.c_[0] - local_d0.c_[2] * local_e8;
  local_100.c_[2] = local_d0.c_[1] * local_e8 - local_d0.c_[0] * local_e0;
  bVar1 = S2::IsUnitLength(&local_100);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x191,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_68.c_[1],"Check failed: S2::IsUnitLength(x) ",0x22);
    if (!bVar1) goto LAB_001f8411;
  }
  if (0.0 <= local_100.c_[2]) {
    local_a8 = sin(local_b8);
    if (ABS(local_a8) < local_100.c_[2]) {
      if (local_100.c_[2] <= 0.0) {
        S2LogMessage::S2LogMessage
                  (&local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                   ,0x19a,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_88.stream_,"Check failed: (x[2]) > (0) ",0x1b);
        goto LAB_001f8411;
      }
      local_a8 = local_a8 / local_100.c_[2];
      local_d8 = 1.0 - local_a8 * local_a8;
      if (local_d8 < 0.0) {
        local_d8 = sqrt(local_d8);
      }
      else {
        local_d8 = SQRT(local_d8);
      }
      local_b8 = atan2(local_d8,local_a8);
      local_90 = atan2(local_78 * a->c_[2] + local_e0 * a->c_[1] + local_e8 * a->c_[0] + 0.0,
                       a->c_[2] * local_100.c_[2] +
                       a->c_[1] * local_100.c_[1] + a->c_[0] * local_100.c_[0] + 0.0);
      dVar2 = atan2(local_78 * b->c_[2] + local_e0 * b->c_[1] + local_e8 * b->c_[0] + 0.0,
                    b->c_[2] * local_100.c_[2] +
                    b->c_[1] * local_100.c_[1] + b->c_[0] * local_100.c_[0] + 0.0);
      local_88 = (S2LogMessage)S1Interval::FromPointPair(local_90,dVar2);
      bVar1 = S1Interval::Contains((S1Interval *)&local_88,local_b8);
      if (bVar1) {
        dVar2 = atan2(local_e0 * local_d8 + local_100.c_[1] * local_a8,
                      local_e8 * local_d8 + local_100.c_[0] * local_a8);
        bVar1 = S1Interval::Contains(lng,dVar2);
        if (bVar1) {
          return true;
        }
      }
      bVar1 = S1Interval::Contains((S1Interval *)&local_88,-local_b8);
      if (bVar1) {
        dVar2 = atan2(local_a8 * local_100.c_[1] - local_e0 * local_d8,
                      local_100.c_[0] * local_a8 - local_e8 * local_d8);
        bVar1 = S1Interval::Contains(lng,dVar2);
        if (bVar1) {
          return true;
        }
      }
    }
    return false;
  }
  S2LogMessage::S2LogMessage
            (&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
             ,0x192,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.stream_,"Check failed: (x[2]) >= (0) ",0x1c);
LAB_001f8411:
  abort();
}

Assistant:

bool S2LatLngRect::IntersectsLatEdge(const S2Point& a, const S2Point& b,
                                     double lat, const S1Interval& lng) {
  // Return true if the segment AB intersects the given edge of constant
  // latitude.  Unfortunately, lines of constant latitude are curves on
  // the sphere.  They can intersect a straight edge in 0, 1, or 2 points.
  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));

  // First, compute the normal to the plane AB that points vaguely north.
  Vector3_d z = S2::RobustCrossProd(a, b).Normalize();
  if (z[2] < 0) z = -z;

  // Extend this to an orthonormal frame (x,y,z) where x is the direction
  // where the great circle through AB achieves its maximium latitude.
  Vector3_d y = S2::RobustCrossProd(z, S2Point(0, 0, 1)).Normalize();
  Vector3_d x = y.CrossProd(z);
  S2_DCHECK(S2::IsUnitLength(x));
  S2_DCHECK_GE(x[2], 0);

  // Compute the angle "theta" from the x-axis (in the x-y plane defined
  // above) where the great circle intersects the given line of latitude.
  double sin_lat = sin(lat);
  if (fabs(sin_lat) >= x[2]) {
    return false;  // The great circle does not reach the given latitude.
  }
  S2_DCHECK_GT(x[2], 0);
  double cos_theta = sin_lat / x[2];
  double sin_theta = sqrt(1 - cos_theta * cos_theta);
  double theta = atan2(sin_theta, cos_theta);

  // The candidate intersection points are located +/- theta in the x-y
  // plane.  For an intersection to be valid, we need to check that the
  // intersection point is contained in the interior of the edge AB and
  // also that it is contained within the given longitude interval "lng".

  // Compute the range of theta values spanned by the edge AB.
  S1Interval ab_theta = S1Interval::FromPointPair(
      atan2(a.DotProd(y), a.DotProd(x)),
      atan2(b.DotProd(y), b.DotProd(x)));

  if (ab_theta.Contains(theta)) {
    // Check if the intersection point is also in the given "lng" interval.
    S2Point isect = x * cos_theta + y * sin_theta;
    if (lng.Contains(atan2(isect[1], isect[0]))) return true;
  }
  if (ab_theta.Contains(-theta)) {
    // Check if the intersection point is also in the given "lng" interval.
    S2Point isect = x * cos_theta - y * sin_theta;
    if (lng.Contains(atan2(isect[1], isect[0]))) return true;
  }
  return false;
}